

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::computeDual(HModel *this)

{
  HMatrix *pHVar1;
  reference pvVar2;
  reference pvVar3;
  HMatrix *in_RDI;
  vector<int,_std::allocator<int>_> *pvVar4;
  double extraout_XMM0_Qa;
  double dVar5;
  double extraout_XMM0_Qa_00;
  double dl_du_1;
  int i_1;
  double dl_du;
  int i;
  double norm_dl_du;
  int mx_n_rp;
  double rp_tl;
  int n_rp;
  int iRow;
  double in_stack_ffffffffffffff50;
  HVector *in_stack_ffffffffffffff58;
  HFactor *in_stack_ffffffffffffff60;
  HVector *in_stack_ffffffffffffff70;
  HVector *in_stack_ffffffffffffffa0;
  HVector *in_stack_ffffffffffffffa8;
  int local_3c;
  int local_2c;
  double local_28;
  double local_18;
  int local_10;
  int local_c;
  
  HVector::clear(in_stack_ffffffffffffff70);
  for (local_c = 0;
      local_c < *(int *)&in_RDI[8].ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage; local_c = local_c + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI[0x15].ARstart,(long)local_c)
    ;
    *pvVar2 = local_c;
    pHVar1 = in_RDI + 0xb;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &in_RDI[10].AR_Nend.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long)local_c);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&pHVar1->Astart,(long)*pvVar2);
    in_stack_ffffffffffffffa0 = (HVector *)*pvVar3;
    pHVar1 = in_RDI + 0xb;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &in_RDI[10].AR_Nend.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long)local_c);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&pHVar1->Avalue,(long)*pvVar2)
    ;
    in_stack_ffffffffffffffa8 = (HVector *)((double)in_stack_ffffffffffffffa0 + *pvVar3);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&in_RDI[0x15].AR_Nend,
                        (long)local_c);
    *pvVar3 = (value_type)in_stack_ffffffffffffffa8;
  }
  *(undefined4 *)
   ((long)&in_RDI[0x15].Avalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) =
       *(undefined4 *)
        &in_RDI[8].ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  HFactor::btran(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  local_10 = 0;
  local_18 = 0.0;
  local_28 = 0.0;
  HVector::clear(in_stack_ffffffffffffff70);
  HMatrix::price_by_col(in_RDI,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  for (local_2c = 0;
      local_2c <
      *(int *)((long)&in_RDI[8].ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 4); local_2c = local_2c + 1) {
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)&in_RDI[0xb].Astart,(long)local_2c);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)
               &in_RDI[0x16].AR_Nend.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish,(long)local_2c);
    pvVar4 = &in_RDI[0xb].Aindex;
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)pvVar4,(long)local_2c);
    std::abs((int)pvVar4);
    if ((local_18 < extraout_XMM0_Qa) && (local_10 < 10)) {
      local_18 = extraout_XMM0_Qa * 10.0;
      local_10 = local_10 + 1;
    }
    local_28 = extraout_XMM0_Qa * extraout_XMM0_Qa + local_28;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&in_RDI[0xb].Astart,
                        (long)local_2c);
    dVar5 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[0x16].AR_Nend.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long)local_2c);
    dVar5 = dVar5 - *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&in_RDI[0xb].Aindex,
                        (long)local_2c);
    *pvVar3 = dVar5;
  }
  for (local_3c = *(int *)((long)&in_RDI[8].ARindex.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish + 4);
      local_3c <
      *(int *)((long)&in_RDI[8].ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 4); local_3c = local_3c + 1) {
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)&in_RDI[0xb].Astart,(long)local_3c);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)&in_RDI[0x15].AR_Nend,
               (long)(local_3c -
                     *(int *)((long)&in_RDI[8].ARindex.super__Vector_base<int,_std::allocator<int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 4)));
    pvVar4 = &in_RDI[0xb].Aindex;
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)pvVar4,(long)local_3c);
    std::abs((int)pvVar4);
    if ((local_18 < extraout_XMM0_Qa_00) && (local_10 < 10)) {
      local_18 = extraout_XMM0_Qa_00 * 10.0;
      local_10 = local_10 + 1;
    }
    local_28 = extraout_XMM0_Qa_00 * extraout_XMM0_Qa_00 + local_28;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&in_RDI[0xb].Astart,
                        (long)local_3c);
    dVar5 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&in_RDI[0x15].AR_Nend,
                        (long)(local_3c -
                              *(int *)((long)&in_RDI[8].ARindex.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_finish + 4)));
    dVar5 = dVar5 - *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&in_RDI[0xb].Aindex,
                        (long)local_3c);
    *pvVar3 = dVar5;
  }
  sqrt(local_28);
  *(undefined4 *)
   ((long)&in_RDI[8].AR_Nend.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 1;
  return;
}

Assistant:

void HModel::computeDual() {
  //  printf("computeDual: Entry\n");cout<<flush;
  buffer.clear();
  for (int iRow = 0; iRow < numRow; iRow++) {
    buffer.index[iRow] = iRow;
    buffer.array[iRow] = workCost[basicIndex[iRow]]
      + workShift[basicIndex[iRow]];
  }
  buffer.count = numRow;

  //  printf("computeDual: Before BTRAN\n");cout<<flush;
  factor.btran(buffer, 1);
  //  printf("computeDual: After  BTRAN\n");cout<<flush;

#ifdef JAJH_dev
    int n_rp = 0;
    double rp_tl = 0.0;
    int mx_n_rp = 10;
    double norm_dl_du = 0.0;
#endif
  
    bufferLong.clear();
    matrix.price_by_col(bufferLong, buffer);
    for (int i = 0; i < numCol; i++) {
#ifdef JAJH_dev
      double dl_du = abs(workCost[i] - bufferLong.array[i] - workDual[i]);
      if (dl_du > rp_tl && n_rp < mx_n_rp) {
	rp_tl = dl_du*10;
	n_rp += 1;
	//	printf("computeDual():     DlDu   = %11g for i = %d\n", dl_du, i);
      }
      norm_dl_du += dl_du*dl_du;
#endif
      workDual[i] = workCost[i] - bufferLong.array[i];
    }
    for (int i = numCol; i < numTot; i++) {
#ifdef JAJH_dev
      double dl_du = abs(workCost[i] - buffer.array[i - numCol] - workDual[i]);
      if (dl_du > rp_tl && n_rp < mx_n_rp) {
	rp_tl = dl_du*10;
	n_rp += 1;
	//	printf("computeDual():     DlDu_i = %11g for i = %d\n", dl_du, i);
      }
      norm_dl_du += dl_du*dl_du;
#endif
      workDual[i] = workCost[i] - buffer.array[i - numCol];
    }
#ifdef JAJH_dev
    norm_dl_du = sqrt(norm_dl_du);
    //    printf("computeDual():   ||DlDu|| = %11g\n", norm_dl_du);
#endif
    //Now have a nonbasic duals
    mlFg_haveNonbasicDuals = 1;
}